

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8.h
# Opt level: O0

void ncnn::conv1x1s2_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  __m256 _v;
  int j;
  int i;
  float *outptr;
  float *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  Option *in_stack_00005fe8;
  Mat *in_stack_00005ff0;
  Mat *in_stack_00005ff8;
  Mat *in_stack_00006000;
  Mat *in_stack_00006008;
  int in_stack_fffffffffffffdcc;
  size_t in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde0;
  Mat *in_stack_fffffffffffffde8;
  Mat *in_stack_fffffffffffffdf0;
  Allocator *in_stack_fffffffffffffdf8;
  int local_1b0;
  int local_1ac;
  Mat local_1a8;
  float *local_160;
  Mat local_158;
  float *local_110;
  int local_108;
  Mat local_f8;
  int local_b0;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  int local_98;
  int local_94;
  float *local_68;
  undefined8 local_60;
  Mat *pMStack_58;
  Mat *pMStack_50;
  undefined8 uStack_48;
  float *local_38;
  
  local_94 = *(int *)(in_RDI + 0x2c);
  local_98 = *(int *)(in_RDI + 0x38);
  local_a0 = *(undefined8 *)(in_RDI + 0x10);
  local_a4 = *(undefined4 *)(in_RDI + 0x18);
  local_a8 = *(int *)(in_RSI + 0x2c);
  local_ac = *(int *)(in_RSI + 0x30);
  local_b0 = (local_94 * 2 + local_a8 * -2) * 8;
  Mat::Mat(&local_f8);
  Mat::create(in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
              (int)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0,
              in_stack_fffffffffffffdcc,in_stack_fffffffffffffdf8);
  for (local_108 = 0; local_108 < local_98; local_108 = local_108 + 1) {
    Mat::channel(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    pfVar1 = Mat::operator_cast_to_float_(&local_158);
    Mat::~Mat((Mat *)0x2e0e2b);
    local_110 = pfVar1;
    Mat::channel(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    pfVar1 = Mat::operator_cast_to_float_(&local_1a8);
    Mat::~Mat((Mat *)0x2e0e77);
    local_160 = pfVar1;
    for (local_1ac = 0; local_1ac < local_ac; local_1ac = local_1ac + 1) {
      for (local_1b0 = 0; local_1b0 < local_a8; local_1b0 = local_1b0 + 1) {
        local_68 = local_110;
        local_60 = *(undefined8 *)local_110;
        in_stack_fffffffffffffde8 = *(Mat **)(local_110 + 2);
        in_stack_fffffffffffffdf0 = *(Mat **)(local_110 + 4);
        uStack_48 = *(undefined8 *)(local_110 + 6);
        local_38 = local_160;
        *(undefined8 *)local_160 = local_60;
        *(Mat **)(local_160 + 2) = in_stack_fffffffffffffde8;
        *(Mat **)(local_160 + 4) = in_stack_fffffffffffffdf0;
        *(undefined8 *)(local_160 + 6) = uStack_48;
        local_110 = local_110 + 0x10;
        local_160 = local_160 + 8;
        pMStack_58 = in_stack_fffffffffffffde8;
        pMStack_50 = in_stack_fffffffffffffdf0;
      }
      local_110 = local_110 + local_b0;
    }
  }
  conv1x1s1_sgemm_pack8_avx
            (in_stack_00006008,in_stack_00006000,in_stack_00005ff8,in_stack_00005ff0,
             in_stack_00005fe8);
  Mat::~Mat((Mat *)0x2e1055);
  return;
}

Assistant:

static void conv1x1s2_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _v = _mm256_loadu_ps(r0);
                _mm256_storeu_ps(outptr, _v);

                r0 += 16;
                outptr += 8;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack8_avx(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}